

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::Generate
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor **ppDVar1;
  _Rb_tree_header *p_Var2;
  size_type *psVar3;
  size_t *psVar4;
  char *pcVar5;
  Context *context;
  long lVar6;
  OneofDescriptor *oneof;
  pointer pcVar7;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  _Var8;
  pointer puVar9;
  bool bVar10;
  int iVar11;
  JavaType type;
  mapped_type *pmVar12;
  LogMessage *pLVar13;
  long *plVar14;
  _Base_ptr p_Var15;
  long lVar16;
  Descriptor *pDVar17;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  ImmutableMessageGenerator *extraout_RDX_01;
  ImmutableMessageGenerator *extraout_RDX_02;
  ImmutableMessageGenerator *pIVar18;
  _func_int **pp_Var19;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_05;
  int iVar20;
  long lVar21;
  uint uVar22;
  char *pcVar23;
  java *this_00;
  long lVar24;
  SubstituteArg local_330;
  SubstituteArg local_300;
  SubstituteArg local_2d0;
  SubstituteArg local_2a0;
  undefined8 local_270;
  undefined4 local_268;
  SubstituteArg local_240;
  char *local_210;
  undefined8 local_208;
  char local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [8];
  string builder_type;
  undefined4 local_1a8;
  undefined2 local_1a0;
  undefined1 local_19e;
  long local_190;
  _Base_ptr local_188;
  _Base_ptr local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  undefined1 local_148 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string out_1;
  SubstituteArg local_e0;
  undefined1 local_b0 [8];
  ImmutableMessageGenerator messageGenerator;
  
  pDVar17 = (this->super_MessageGenerator).descriptor_;
  if (*(long *)(pDVar17 + 0x18) == 0) {
    pcVar23 = "static ";
    if (*(char *)(*(long *)(*(long *)(pDVar17 + 0x10) + 0x88) + 0x98) != '\0') {
      pcVar23 = "";
    }
  }
  else {
    pcVar23 = "static ";
  }
  local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178._M_impl.super__Rb_tree_header._M_header;
  local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppDVar1 = &messageGenerator.super_MessageGenerator.descriptor_;
  local_178._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b0 = (undefined1  [8])ppDVar1;
  messageGenerator.field_generators_.field_generators_.
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)printer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"static","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_178,(key_type *)local_b0);
  pcVar5 = (char *)pmVar12->_M_string_length;
  strlen(pcVar23);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,pcVar5,(ulong)pcVar23);
  if (local_b0 != (undefined1  [8])ppDVar1) {
    operator_delete((void *)local_b0);
  }
  local_b0 = (undefined1  [8])ppDVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"classname","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_178,(key_type *)local_b0);
  std::__cxx11::string::_M_assign((string *)pmVar12);
  pDVar17 = extraout_RDX;
  if (local_b0 != (undefined1  [8])ppDVar1) {
    operator_delete((void *)local_b0);
    pDVar17 = extraout_RDX_00;
  }
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)local_b0,(java *)(this->super_MessageGenerator).descriptor_,pDVar17);
  p_Var2 = &vars._M_t._M_impl.super__Rb_tree_header;
  local_148 = (undefined1  [8])p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"extra_interfaces","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_178,(key_type *)local_148);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)local_b0);
  if (local_148 != (undefined1  [8])p_Var2) {
    operator_delete((void *)local_148);
  }
  if (local_b0 != (undefined1  [8])ppDVar1) {
    operator_delete((void *)local_b0);
  }
  messageGenerator.super_MessageGenerator.descriptor_._0_2_ = 0x3356;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)0x2;
  messageGenerator.super_MessageGenerator.descriptor_._2_1_ = 0;
  local_148 = (undefined1  [8])p_Var2;
  local_b0 = (undefined1  [8])ppDVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"ver","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_178,(key_type *)local_148);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)local_b0);
  if (local_148 != (undefined1  [8])p_Var2) {
    operator_delete((void *)local_148);
  }
  if (local_b0 != (undefined1  [8])ppDVar1) {
    operator_delete((void *)local_b0);
  }
  pcVar23 = "";
  if (*(char *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x20) + 0x4a) != '\0') {
    pcVar23 = "@java.lang.Deprecated ";
  }
  local_b0 = (undefined1  [8])ppDVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"deprecation","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_178,(key_type *)local_b0);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,(ulong)pcVar23);
  if (local_b0 != (undefined1  [8])ppDVar1) {
    operator_delete((void *)local_b0);
  }
  WriteMessageDocComment
            ((Printer *)
             messageGenerator.field_generators_.field_generators_.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (this->super_MessageGenerator).descriptor_);
  pDVar17 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  local_b0 = (undefined1  [8])ppDVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,(Printer *)
                     messageGenerator.field_generators_.field_generators_.
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pDVar17,true,
             (string *)local_b0);
  if (local_b0 != (undefined1  [8])ppDVar1) {
    operator_delete((void *)local_b0);
  }
  puVar9 = messageGenerator.field_generators_.field_generators_.
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1d0 = (undefined1  [8])&builder_type._M_string_length;
  builder_type._M_dataplus._M_p = (pointer)0x0;
  builder_type._M_string_length._0_1_ = 0;
  if (*(int *)((this->super_MessageGenerator).descriptor_ + 0x7c) < 1) {
    google::protobuf::io::Printer::Print
              ((map *)messageGenerator.field_generators_.field_generators_.
                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(char *)&local_178);
    io::Printer::Annotate<google::protobuf::Descriptor>
              ((Printer *)puVar9,"classname","classname",(this->super_MessageGenerator).descriptor_)
    ;
    google::protobuf::io::Printer::Print((map *)puVar9,(char *)&local_178);
    local_1a0 = 0x3356;
    local_19e = 0;
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)
         CONCAT44(messageGenerator.super_MessageGenerator._vptr_MessageGenerator._4_4_,2);
    local_148 = (undefined1  [8])0x0;
    vars._M_t._M_impl._0_4_ = 0xffffffff;
    local_e0.text_ = (char *)0x0;
    local_e0.size_ = -1;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    out_1._M_dataplus._M_p._0_4_ = 0xffffffff;
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    local_330.text_ = (char *)0x0;
    local_330.size_ = -1;
    local_300.text_ = (char *)0x0;
    local_300.size_ = -1;
    local_2d0.text_ = (char *)0x0;
    local_2d0.size_ = -1;
    local_2a0.text_ = (char *)0x0;
    local_2a0.size_ = -1;
    local_270 = 0;
    local_268 = 0xffffffff;
    builder_type.field_2._8_8_ = &stack0xfffffffffffffe60;
    local_b0 = (undefined1  [8])&stack0xfffffffffffffe60;
    google::protobuf::strings::Substitute_abi_cxx11_
              ((char *)local_1f0,
               (SubstituteArg *)"com.google.protobuf.GeneratedMessage$0.Builder<?>",
               (SubstituteArg *)local_b0,(SubstituteArg *)local_148,&local_e0,
               (SubstituteArg *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_240,
               &local_330,&local_300,&local_2d0,&local_2a0);
    std::__cxx11::string::operator=((string *)local_1d0,(string *)local_1f0);
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0]);
    }
    if ((undefined2 *)builder_type.field_2._8_8_ == &stack0xfffffffffffffe60) goto LAB_0021c276;
  }
  else {
    google::protobuf::io::Printer::Print
              ((map *)messageGenerator.field_generators_.field_generators_.
                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(char *)&local_178);
    io::Printer::Annotate<google::protobuf::Descriptor>
              ((Printer *)puVar9,"classname","classname",(this->super_MessageGenerator).descriptor_)
    ;
    google::protobuf::io::Printer::Print((map *)puVar9,(char *)&local_178);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)((long)&builder_type.field_2 + 8),this->name_resolver_,
               (this->super_MessageGenerator).descriptor_,true);
    local_b0 = (undefined1  [8])builder_type.field_2._8_8_;
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)
         CONCAT44(messageGenerator.super_MessageGenerator._vptr_MessageGenerator._4_4_,local_1a8);
    local_200[0] = 'V';
    local_200[1] = '3';
    local_208 = 2;
    local_200[2] = 0;
    vars._M_t._M_impl._0_4_ = 2;
    local_e0.text_ = (char *)0x0;
    local_e0.size_ = -1;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    out_1._M_dataplus._M_p._0_4_ = 0xffffffff;
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    local_330.text_ = (char *)0x0;
    local_330.size_ = -1;
    local_300.text_ = (char *)0x0;
    local_300.size_ = -1;
    local_2d0.text_ = (char *)0x0;
    local_2d0.size_ = -1;
    local_2a0.text_ = (char *)0x0;
    local_2a0.size_ = -1;
    local_270 = 0;
    local_268 = 0xffffffff;
    local_210 = local_200;
    local_148 = (undefined1  [8])local_200;
    google::protobuf::strings::Substitute_abi_cxx11_
              ((char *)local_1f0,
               (SubstituteArg *)"com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
               (SubstituteArg *)local_b0,(SubstituteArg *)local_148,&local_e0,
               (SubstituteArg *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_240,
               &local_330,&local_300,&local_2d0,&local_2a0);
    std::__cxx11::string::operator=((string *)local_1d0,(string *)local_1f0);
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0]);
    }
    if (local_210 != local_200) {
      operator_delete(local_210);
    }
    if ((undefined2 *)builder_type.field_2._8_8_ == &stack0xfffffffffffffe60) goto LAB_0021c276;
  }
  operator_delete((void *)builder_type.field_2._8_8_);
LAB_0021c276:
  io::Printer::Print<>((Printer *)puVar9,"private static final long serialVersionUID = 0L;\n");
  google::protobuf::io::Printer::Indent();
  io::Printer::Print<char[10],std::__cxx11::string,char[12],std::__cxx11::string>
            ((Printer *)puVar9,
             "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n}\n"
             ,(char (*) [10])0x2949ca,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (this->super_MessageGenerator).descriptor_,(char (*) [12])"buildertype",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)puVar9,"private $classname$() {\n",(char (*) [10])0x2949ca,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (this->super_MessageGenerator).descriptor_);
  google::protobuf::io::Printer::Indent();
  GenerateInitializers(this,(Printer *)puVar9);
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>((Printer *)puVar9,"}\n\n");
  google::protobuf::io::Printer::Print((map *)puVar9,(char *)&local_178);
  io::Printer::Print<>
            ((Printer *)puVar9,
             "@java.lang.Override\npublic final com.google.protobuf.UnknownFieldSet\ngetUnknownFields() {\n  return this.unknownFields;\n}\n"
            );
  bVar10 = Context::HasGeneratedMethods(this->context_,(this->super_MessageGenerator).descriptor_);
  if (bVar10) {
    GenerateParsingConstructor(this,(Printer *)puVar9);
  }
  GenerateDescriptorMethods(this,(Printer *)puVar9);
  pDVar17 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar17 + 0x78)) {
    lVar21 = 0;
    lVar24 = 0;
    do {
      EnumGenerator::EnumGenerator
                ((EnumGenerator *)local_b0,(EnumDescriptor *)(*(long *)(pDVar17 + 0x40) + lVar21),
                 true,this->context_);
      EnumGenerator::Generate((EnumGenerator *)local_b0,(Printer *)puVar9);
      EnumGenerator::~EnumGenerator((EnumGenerator *)local_b0);
      lVar24 = lVar24 + 1;
      pDVar17 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0x50;
    } while (lVar24 < *(int *)(pDVar17 + 0x78));
  }
  if (0 < *(int *)(pDVar17 + 0x74)) {
    lVar21 = 0;
    lVar24 = 0;
    do {
      if (*(char *)(*(long *)(*(long *)(pDVar17 + 0x38) + 0x20 + lVar21) + 0x4b) == '\0') {
        ImmutableMessageGenerator
                  ((ImmutableMessageGenerator *)local_b0,
                   (Descriptor *)(*(long *)(pDVar17 + 0x38) + lVar21),this->context_);
        GenerateInterface((ImmutableMessageGenerator *)local_b0,(Printer *)puVar9);
        Generate((ImmutableMessageGenerator *)local_b0,(Printer *)puVar9);
        ~ImmutableMessageGenerator((ImmutableMessageGenerator *)local_b0);
        pDVar17 = (this->super_MessageGenerator).descriptor_;
      }
      lVar24 = lVar24 + 1;
      lVar21 = lVar21 + 0x90;
    } while (lVar24 < *(int *)(pDVar17 + 0x74));
  }
  if (0 < *(int *)(pDVar17 + 0x68)) {
    lVar24 = 0;
    lVar21 = 0;
    iVar20 = 0;
    do {
      lVar16 = *(long *)(pDVar17 + 0x28);
      if (*(Descriptor **)(lVar16 + 0x50 + lVar24) != (this->field_generators_).descriptor_) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/compiler/java/java_field.h"
                   ,0x87);
        pLVar13 = (LogMessage *)
                  google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_b0,
                             "CHECK failed: (field->containing_type()) == (descriptor_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_148,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
      }
      if (*(char *)(lVar16 + 0x43 + lVar24) == '\0') {
        plVar14 = (long *)(*(long *)(lVar16 + 0x50 + lVar24) + 0x28);
      }
      else {
        lVar6 = *(long *)(lVar16 + 0x60 + lVar24);
        if (lVar6 == 0) {
          plVar14 = (long *)(*(long *)(lVar16 + 0x28 + lVar24) + 0x80);
        }
        else {
          plVar14 = (long *)(lVar6 + 0x50);
        }
      }
      iVar11 = (**(code **)(*(long *)(this->field_generators_).field_generators_.
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [(int)((ulong)((lVar16 - *plVar14) + lVar24) >> 3) * 0x286bca1b
                                     ]._M_t.
                                     super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                     ._M_t + 0x10))();
      iVar20 = iVar20 + iVar11;
      lVar21 = lVar21 + 1;
      pDVar17 = (this->super_MessageGenerator).descriptor_;
      lVar24 = lVar24 + 0x98;
    } while (lVar21 < *(int *)(pDVar17 + 0x68));
    if (0 < iVar20) {
      this_00 = (java *)0x0;
      pIVar18 = this;
      do {
        GetBitFieldName_abi_cxx11_((string *)local_b0,this_00,(int)pIVar18);
        io::Printer::Print<char[15],std::__cxx11::string>
                  ((Printer *)
                   messageGenerator.field_generators_.field_generators_.
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "private int $bit_field_name$;\n",(char (*) [15])"bit_field_name",
                   (string *)local_b0);
        pIVar18 = extraout_RDX_01;
        if (local_b0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
          operator_delete((void *)local_b0);
          pIVar18 = extraout_RDX_02;
        }
        uVar22 = (int)this_00 + 1;
        this_00 = (java *)(ulong)uVar22;
      } while (iVar20 + 0x1fU >> 5 != uVar22);
    }
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
  vars._M_t._M_impl._0_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var15 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_left;
  local_180 = &(this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var15 != local_180) {
    psVar3 = &out_1._M_string_length;
    do {
      oneof = *(OneofDescriptor **)(p_Var15 + 1);
      local_188 = p_Var15;
      Context::GetOneofGeneratorInfo(this->context_,oneof);
      local_b0 = (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"oneof_name","");
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_148,(key_type *)local_b0);
      std::__cxx11::string::_M_assign((string *)pmVar12);
      if (local_b0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
        operator_delete((void *)local_b0);
      }
      Context::GetOneofGeneratorInfo(this->context_,oneof);
      local_b0 = (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,"oneof_capitalized_name","");
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_148,(key_type *)local_b0);
      std::__cxx11::string::_M_assign((string *)pmVar12);
      if (local_b0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
        operator_delete((void *)local_b0);
      }
      ppDVar1 = &messageGenerator.super_MessageGenerator.descriptor_;
      local_b0 = (undefined1  [8])ppDVar1;
      lVar21 = google::protobuf::FastInt32ToBufferLeft
                         ((int)((ulong)((long)oneof - *(long *)(*(long *)(oneof + 0x10) + 0x30)) >>
                               4) * -0x55555555,(char *)ppDVar1);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)(lVar21 - (long)ppDVar1);
      local_e0.text_ = local_e0.scratch_ + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,local_b0,
                 (pointer)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                          (long)local_b0));
      psVar4 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)psVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)psVar4,"oneof_index","");
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_148,(key_type *)psVar4);
      std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_e0);
      if ((size_type *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count != psVar3) {
        operator_delete((void *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      if (local_e0.text_ != local_e0.scratch_ + 4) {
        operator_delete(local_e0.text_);
      }
      google::protobuf::io::Printer::Print
                ((map *)messageGenerator.field_generators_.field_generators_.
                        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
      google::protobuf::io::Printer::Print
                ((map *)messageGenerator.field_generators_.field_generators_.
                        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
      google::protobuf::io::Printer::Indent();
      if (0 < *(int *)(oneof + 0x18)) {
        lVar21 = 0;
        do {
          plVar14 = *(long **)(*(long *)(oneof + 0x20) + lVar21 * 8);
          local_240.text_ = "";
          if (*(char *)(plVar14[0xf] + 0x4e) != '\0') {
            local_240.text_ = "@java.lang.Deprecated ";
          }
          local_e0.text_ = local_e0.scratch_ + 4;
          lVar24 = *(long *)*plVar14;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,lVar24,((long *)*plVar14)[1] + lVar24);
          if (CONCAT44(local_e0.scratch_._0_4_,local_e0.size_) != 0) {
            lVar24 = 0;
            do {
              if ((byte)(local_e0.text_[lVar24] + 0x9fU) < 0x1a) {
                local_e0.text_[lVar24] = local_e0.text_[lVar24] + -0x20;
              }
              lVar24 = lVar24 + 1;
            } while (CONCAT44(local_e0.scratch_._0_4_,local_e0.size_) != lVar24);
          }
          ppDVar1 = &messageGenerator.super_MessageGenerator.descriptor_;
          local_b0 = (undefined1  [8])ppDVar1;
          lVar24 = google::protobuf::FastInt32ToBufferLeft
                             (*(int *)((long)plVar14 + 0x44),(char *)ppDVar1);
          psVar4 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
          messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
               (_func_int **)(lVar24 - (long)ppDVar1);
          vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)psVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)psVar4,local_b0,
                     (pointer)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator
                              + (long)local_b0));
          io::Printer::
          Print<char[12],char_const*,char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                    ((Printer *)
                     messageGenerator.field_generators_.field_generators_.
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "$deprecation$$field_name$($field_number$),\n",(char (*) [12])"deprecation",
                     &local_240.text_,(char (*) [11])0x2b43ea,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
                     (char (*) [13])"field_number",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar4);
          if ((size_type *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count != psVar3) {
            operator_delete((void *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          if (local_e0.text_ != local_e0.scratch_ + 4) {
            operator_delete(local_e0.text_);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < *(int *)(oneof + 0x18));
      }
      local_e0.text_ = local_e0.scratch_ + 4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"oneof_name","");
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_148,(key_type *)&local_e0);
      local_b0 = (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_;
      pcVar7 = (pmVar12->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,pcVar7,pcVar7 + pmVar12->_M_string_length);
      if (messageGenerator.super_MessageGenerator._vptr_MessageGenerator != (_func_int **)0x0) {
        pp_Var19 = (_func_int **)0x0;
        do {
          if ((byte)(*(char *)((long)local_b0 + (long)pp_Var19) + 0x9fU) < 0x1a) {
            *(char *)((long)local_b0 + (long)pp_Var19) =
                 *(char *)((long)local_b0 + (long)pp_Var19) + -0x20;
          }
          pp_Var19 = (_func_int **)((long)pp_Var19 + 1);
        } while (messageGenerator.super_MessageGenerator._vptr_MessageGenerator != pp_Var19);
      }
      io::Printer::Print<char[15],std::__cxx11::string>
                ((Printer *)
                 messageGenerator.field_generators_.field_generators_.
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,"$cap_oneof_name$_NOT_SET(0);\n"
                 ,(char (*) [15])"cap_oneof_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
      if (local_b0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
        operator_delete((void *)local_b0);
      }
      if (local_e0.text_ != local_e0.scratch_ + 4) {
        operator_delete(local_e0.text_);
      }
      google::protobuf::io::Printer::Print
                ((map *)messageGenerator.field_generators_.field_generators_.
                        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
      google::protobuf::io::Printer::Print
                ((map *)messageGenerator.field_generators_.field_generators_.
                        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
      if (0 < *(int *)(oneof + 0x18)) {
        lVar21 = 0;
        do {
          plVar14 = *(long **)(*(long *)(oneof + 0x20) + lVar21 * 8);
          ppDVar1 = &messageGenerator.super_MessageGenerator.descriptor_;
          local_190 = lVar21;
          local_b0 = (undefined1  [8])ppDVar1;
          lVar21 = google::protobuf::FastInt32ToBufferLeft
                             (*(int *)((long)plVar14 + 0x44),(char *)ppDVar1);
          messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
               (_func_int **)(lVar21 - (long)ppDVar1);
          local_e0.text_ = local_e0.scratch_ + 4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,local_b0,
                     (pointer)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator
                              + (long)local_b0));
          plVar14 = (long *)*plVar14;
          lVar21 = *plVar14;
          vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)psVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,lVar21,
                     plVar14[1] + lVar21);
          if (CONCAT44(out_1._M_dataplus._M_p._4_4_,out_1._M_dataplus._M_p._0_4_) != 0) {
            lVar21 = 0;
            do {
              if ((byte)(*(char *)(vars._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar21) +
                        0x9fU) < 0x1a) {
                *(char *)(vars._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar21) =
                     *(char *)(vars._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar21) +
                     -0x20;
              }
              lVar21 = lVar21 + 1;
            } while (CONCAT44(out_1._M_dataplus._M_p._4_4_,out_1._M_dataplus._M_p._0_4_) != lVar21);
          }
          io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                    ((Printer *)
                     messageGenerator.field_generators_.field_generators_.
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "    case $field_number$: return $field_name$;\n",(char (*) [13])"field_number"
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0
                     ,(char (*) [11])0x2b43ea,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if ((size_type *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count != psVar3) {
            operator_delete((void *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          if (local_e0.text_ != local_e0.scratch_ + 4) {
            operator_delete(local_e0.text_);
          }
          lVar21 = local_190 + 1;
        } while (lVar21 < *(int *)(oneof + 0x18));
      }
      local_e0.text_ = local_e0.scratch_ + 4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"oneof_name","");
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_148,(key_type *)&local_e0);
      puVar9 = messageGenerator.field_generators_.field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ppDVar1 = &messageGenerator.super_MessageGenerator.descriptor_;
      pcVar7 = (pmVar12->_M_dataplus)._M_p;
      local_b0 = (undefined1  [8])ppDVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,pcVar7,pcVar7 + pmVar12->_M_string_length);
      if (messageGenerator.super_MessageGenerator._vptr_MessageGenerator != (_func_int **)0x0) {
        pp_Var19 = (_func_int **)0x0;
        do {
          if ((byte)(*(char *)((long)local_b0 + (long)pp_Var19) + 0x9fU) < 0x1a) {
            *(char *)((long)local_b0 + (long)pp_Var19) =
                 *(char *)((long)local_b0 + (long)pp_Var19) + -0x20;
          }
          pp_Var19 = (_func_int **)((long)pp_Var19 + 1);
        } while (messageGenerator.super_MessageGenerator._vptr_MessageGenerator != pp_Var19);
      }
      io::Printer::Print<char[15],std::__cxx11::string>
                ((Printer *)puVar9,
                 "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
                 ,(char (*) [15])"cap_oneof_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
      if (local_b0 != (undefined1  [8])ppDVar1) {
        operator_delete((void *)local_b0);
      }
      if (local_e0.text_ != local_e0.scratch_ + 4) {
        operator_delete(local_e0.text_);
      }
      google::protobuf::io::Printer::Outdent();
      io::Printer::Print<>
                ((Printer *)
                 messageGenerator.field_generators_.field_generators_.
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,"};\n\n");
      google::protobuf::io::Printer::Print
                ((map *)messageGenerator.field_generators_.field_generators_.
                        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(local_188);
    } while (p_Var15 != local_180);
  }
  iVar20 = std::__cxx11::string::compare(*(char **)((this->super_MessageGenerator).descriptor_ + 8))
  ;
  field = extraout_RDX_03;
  if (iVar20 == 0) {
    io::Printer::Print<>
              ((Printer *)
               messageGenerator.field_generators_.field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "private static String getTypeUrl(\n    java.lang.String typeUrlPrefix,\n    com.google.protobuf.Descriptors.Descriptor descriptor) {\n  return typeUrlPrefix.endsWith(\"/\")\n      ? typeUrlPrefix + descriptor.getFullName()\n      : typeUrlPrefix + \"/\" + descriptor.getFullName();\n}\n\nprivate static String getTypeNameFromTypeUrl(\n    java.lang.String typeUrl) {\n  int pos = typeUrl.lastIndexOf(\'/\');\n  return pos == -1 ? \"\" : typeUrl.substring(pos + 1);\n}\n\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(\"type.googleapis.com\",\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\n/**\n * Packs a message using the given type URL prefix. The type URL will\n * be constructed by concatenating the message type\'s full name to the\n * prefix with an optional \"/\" separator if the prefix doesn\'t end\n * with \"/\" already.\n */\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message, java.lang.String typeUrlPrefix) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(typeUrlPrefix,\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\npublic <T extends com.google.protobuf.Message> boolean is(\n    java.lang.Class<T> clazz) {\n  T defaultInstance =\n      com.google.protobuf.Internal.getDefaultInstance(clazz);\n  return getTypeNameFromTypeUrl(getTypeUrl()).equals(\n      defaultInstance.getDescriptorForType().getFullName());\n}\n\nprivate volatile com.google.protobuf.Message cachedUnpackValue;\n\n@java.lang.SuppressWarnings(\"unchecked\")\npublic <T extends com.google.protobuf.Message> T unpack(\n    java.lang.Class<T> clazz)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  boolean invalidClazz = false;\n  if (cachedUnpackValue != null) {\n    if (cachedUnpackValue.getClass() == clazz) {\n      return (T) cachedUnpackValue;\n    }\n    invalidClazz = true;\n  }\n  if (invalidClazz || !is(clazz)) {\n    t..." /* TRUNCATED STRING LITERAL */
              );
    field = extraout_RDX_04;
  }
  pDVar17 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar17 + 0x68)) {
    lVar24 = 0;
    psVar4 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
    lVar21 = 0;
    do {
      FieldConstantName_abi_cxx11_
                ((string *)&local_e0,(java *)(*(long *)(pDVar17 + 0x28) + lVar24),field);
      ppDVar1 = &messageGenerator.super_MessageGenerator.descriptor_;
      local_b0 = (undefined1  [8])ppDVar1;
      lVar16 = google::protobuf::FastInt32ToBufferLeft
                         (*(int *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) +
                                   0x44 + lVar24),(char *)ppDVar1);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)(lVar16 - (long)ppDVar1);
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&out_1._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)psVar4,local_b0,
                 (pointer)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                          (long)local_b0));
      io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
                ((Printer *)
                 messageGenerator.field_generators_.field_generators_.
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 "public static final int $constant_name$ = $number$;\n",(char (*) [14])0x2a240d,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
                 (char (*) [7])0x2b4513,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar4);
      if ((size_type *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          &out_1._M_string_length) {
        operator_delete((void *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      if (local_e0.text_ != local_e0.scratch_ + 4) {
        operator_delete(local_e0.text_);
      }
      lVar16 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x28);
      if (*(Descriptor **)(lVar16 + 0x50 + lVar24) != (this->field_generators_).descriptor_) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/compiler/java/java_field.h"
                   ,0x87);
        pLVar13 = (LogMessage *)
                  google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_b0,
                             "CHECK failed: (field->containing_type()) == (descriptor_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_e0,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
      }
      if (*(char *)(lVar16 + 0x43 + lVar24) == '\0') {
        plVar14 = (long *)(*(long *)(lVar16 + 0x50 + lVar24) + 0x28);
      }
      else {
        lVar6 = *(long *)(lVar16 + 0x60 + lVar24);
        if (lVar6 == 0) {
          plVar14 = (long *)(*(long *)(lVar16 + 0x28 + lVar24) + 0x80);
        }
        else {
          plVar14 = (long *)(lVar6 + 0x50);
        }
      }
      _Var8._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
      _M_head_impl = (this->field_generators_).field_generators_.
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [(int)((ulong)((lVar16 - *plVar14) + lVar24) >> 3) * 0x286bca1b]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var8._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                            ._M_head_impl + 0x28))
                (_Var8._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                 ._M_head_impl,
                 messageGenerator.field_generators_.field_generators_.
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      io::Printer::Print<>
                ((Printer *)
                 messageGenerator.field_generators_.field_generators_.
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,"\n");
      lVar21 = lVar21 + 1;
      pDVar17 = (this->super_MessageGenerator).descriptor_;
      lVar24 = lVar24 + 0x98;
      field = extraout_RDX_05;
    } while (lVar21 < *(int *)(pDVar17 + 0x68));
  }
  bVar10 = Context::HasGeneratedMethods(this->context_,pDVar17);
  puVar9 = messageGenerator.field_generators_.field_generators_.
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppDVar1 = &messageGenerator.super_MessageGenerator.descriptor_;
  if (bVar10) {
    GenerateIsInitialized
              (this,(Printer *)
                    messageGenerator.field_generators_.field_generators_.
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    GenerateMessageSerializationMethods(this,(Printer *)puVar9);
    GenerateEqualsAndHashCode(this,(Printer *)puVar9);
  }
  GenerateParseFromMethods(this,(Printer *)puVar9);
  GenerateBuilder(this,(Printer *)puVar9);
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)puVar9,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n",
             (char (*) [10])0x2932bf,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((this->super_MessageGenerator).descriptor_ + 8));
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_b0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true
            );
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)puVar9,"private static final $classname$ DEFAULT_INSTANCE;\n",
             (char (*) [10])0x2949ca,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  if (local_b0 != (undefined1  [8])ppDVar1) {
    operator_delete((void *)local_b0);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_b0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true
            );
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)puVar9,"static {\n  DEFAULT_INSTANCE = new $classname$();\n}\n\n",
             (char (*) [10])0x2949ca,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  if (local_b0 != (undefined1  [8])ppDVar1) {
    operator_delete((void *)local_b0);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_b0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true
            );
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)puVar9,
             "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n",
             (char (*) [10])0x2949ca,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  if (local_b0 != (undefined1  [8])ppDVar1) {
    operator_delete((void *)local_b0);
  }
  iVar20 = std::__cxx11::string::compare
                     ((char *)**(undefined8 **)((this->super_MessageGenerator).descriptor_ + 0x10));
  if (iVar20 == 0) {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_b0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
               true);
    type = GetJavaType(*(FieldDescriptor **)((this->super_MessageGenerator).descriptor_ + 0x28));
    local_e0.text_ = PrimitiveTypeName(type);
    io::Printer::Print<char[10],std::__cxx11::string,char[11],char_const*>
              ((Printer *)puVar9,
               "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
               ,(char (*) [10])0x2949ca,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
               (char (*) [11])0x29af47,&local_e0.text_);
    if (local_b0 != (undefined1  [8])ppDVar1) {
      operator_delete((void *)local_b0);
    }
  }
  GenerateParser(this,(Printer *)puVar9);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_b0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true
            );
  io::Printer::Print<char[10],std::__cxx11::string>
            ((Printer *)puVar9,
             "@java.lang.Override\npublic $classname$ getDefaultInstanceForType() {\n  return DEFAULT_INSTANCE;\n}\n\n"
             ,(char (*) [10])0x2949ca,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  if (local_b0 != (undefined1  [8])ppDVar1) {
    operator_delete((void *)local_b0);
  }
  pDVar17 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar17 + 0x80)) {
    lVar21 = 0;
    lVar24 = 0;
    do {
      ImmutableExtensionGenerator::ImmutableExtensionGenerator
                ((ImmutableExtensionGenerator *)local_b0,
                 (FieldDescriptor *)(*(long *)(pDVar17 + 0x50) + lVar21),this->context_);
      ImmutableExtensionGenerator::Generate
                ((ImmutableExtensionGenerator *)local_b0,(Printer *)puVar9);
      ImmutableExtensionGenerator::~ImmutableExtensionGenerator
                ((ImmutableExtensionGenerator *)local_b0);
      lVar24 = lVar24 + 1;
      pDVar17 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0x98;
    } while (lVar24 < *(int *)(pDVar17 + 0x80));
  }
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>((Printer *)puVar9,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_148);
  if (local_1d0 != (undefined1  [8])&builder_type._M_string_length) {
    operator_delete((void *)local_1d0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_178);
  return;
}

Assistant:

void ImmutableMessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<std::string, std::string> variables;
  variables["static"] = is_own_file ? "" : "static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["ver"] = GeneratedCodeVersionSuffix();
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);

  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(
        variables,
        "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n"
        "      $classname$> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_),
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(variables,
                   "    com.google.protobuf.GeneratedMessage$ver$ implements\n"
                   "    $extra_interfaces$\n"
                   "    $classname$OrBuilder {\n");
    builder_type =
        strings::Substitute("com.google.protobuf.GeneratedMessage$0.Builder<?>",
                         GeneratedCodeVersionSuffix());
  }
  printer->Print("private static final long serialVersionUID = 0L;\n");

  printer->Indent();
  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
      "// Use $classname$.newBuilder() to construct.\n"
      "private $classname$($buildertype$ builder) {\n"
      "  super(builder);\n"
      "}\n",
      "classname", descriptor_->name(), "buildertype", builder_type);
  printer->Print("private $classname$() {\n", "classname", descriptor_->name());
  printer->Indent();
  GenerateInitializers(printer);
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(variables,
                 "@java.lang.Override\n"
                 "@SuppressWarnings({\"unused\"})\n"
                 "protected java.lang.Object newInstance(\n"
                 "    UnusedPrivateParameter unused) {\n"
                 "  return new $classname$();\n"
                 "}\n"
                 "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public final com.google.protobuf.UnknownFieldSet\n"
      "getUnknownFields() {\n"
      "  return this.unknownFields;\n"
      "}\n");

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateParsingConstructor(printer);
  }

  GenerateDescriptorMethods(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i), true, context_).Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator messageGenerator(descriptor_->nested_type(i),
                                               context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (auto oneof : oneofs_) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat((oneof)->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(
        vars,
        "public enum $oneof_capitalized_name$Case\n"
        // TODO(dweis): Remove EnumLite when we want to break compatibility with
        // 3.x users
        "    implements com.google.protobuf.Internal.EnumLite,\n"
        "        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n");
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print(
          "$deprecation$$field_name$($field_number$),\n", "deprecation",
          field->options().deprecated() ? "@java.lang.Deprecated " : "",
          "field_name", ToUpper(field->name()), "field_number",
          StrCat(field->number()));
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   ToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    printer->Print(
        vars,
        "/**\n"
        " * @param value The number of the enum to look for.\n"
        " * @return The enum associated with the given number.\n"
        " * @deprecated Use {@link #forNumber(int)} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
        "  return forNumber(value);\n"
        "}\n"
        "\n"
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", StrCat(field->number()),
                     "field_name", ToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "public $oneof_capitalized_name$Case\n"
                   "get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n");
  }

  if (IsAnyMessage(descriptor_)) {
    GenerateAnyMethods(printer);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", StrCat(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateMessageSerializationMethods(printer);
    GenerateEqualsAndHashCode(printer);
  }


  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));
  printer->Print(
      "static {\n"
      "  DEFAULT_INSTANCE = new $classname$();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ getDefaultInstanceForType() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}